

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O1

void __thiscall ImageInput::~ImageInput(ImageInput *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer puVar3;
  void *pvVar4;
  pointer pcVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int in_ESI;
  
  this->_vptr_ImageInput = (_func_int **)&PTR__ImageInput_001b6078;
  close(this,in_ESI);
  p_Var2 = (this->sendWarning).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->sendWarning,(_Any_data *)&this->sendWarning,__destroy_functor);
  }
  Imageio::std::vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_>::~vector
            (&this->images);
  puVar3 = (this->nativeBuffer8).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->nativeBuffer8).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pvVar4 = *(void **)&this->nativeBuffer16;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&this->field_0x270 - (long)pvVar4);
  }
  pcVar5 = (this->_filename)._M_dataplus._M_p;
  paVar1 = &(this->_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pbVar6 = (this->buffer)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar6 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar6 + 8))();
  }
  (this->buffer)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::ifstream::~ifstream(&this->file);
  return;
}

Assistant:

virtual ~ImageInput() { close(); }